

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O3

void __thiscall EnrichableI2cAnalyzer::SetupResults(EnrichableI2cAnalyzer *this)

{
  EnrichableI2cAnalyzerResults *pEVar1;
  EnrichableI2cAnalyzerResults *this_00;
  
  this_00 = (EnrichableI2cAnalyzerResults *)operator_new(0x28);
  EnrichableI2cAnalyzerResults::EnrichableI2cAnalyzerResults
            (this_00,this,(this->mSettings)._M_ptr,(this->mSubprocess)._M_ptr);
  pEVar1 = (this->mResults)._M_ptr;
  if (pEVar1 != this_00) {
    if (pEVar1 != (EnrichableI2cAnalyzerResults *)0x0) {
      (**(code **)(*(long *)pEVar1 + 8))();
    }
    (this->mResults)._M_ptr = this_00;
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void EnrichableI2cAnalyzer::SetupResults()
{
	mResults.reset( new EnrichableI2cAnalyzerResults( this, mSettings.get(), mSubprocess.get() ) );
	SetAnalyzerResults( mResults.get() );
	mResults->AddChannelBubblesWillAppearOn( mSettings->mSdaChannel );
}